

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O1

void __thiscall ag::FunctionData::~FunctionData(FunctionData *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->Name)._M_dataplus._M_p;
  paVar2 = &(this->Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->Object)._M_dataplus._M_p;
  paVar2 = &(this->Object).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

FunctionData() : Object(""), Name(""), Arguments(0) {}